

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void loadExt(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db;
  int iVar1;
  char *zFile;
  char *zProc;
  long in_FS_OFFSET;
  char *zErrMsg;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  zFile = (char *)sqlite3ValueText(*argv,'\x01');
  db = context->pOut->db;
  local_38 = (char *)0x0;
  if ((db->flags & 0x20000) == 0) {
    context->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      sqlite3VdbeMemSetStr
                (context->pOut,"not authorized",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
      ;
      return;
    }
  }
  else {
    if (argc == 2) {
      zProc = (char *)sqlite3ValueText(argv[1],'\x01');
    }
    else {
      zProc = (char *)0x0;
    }
    if (zFile != (char *)0x0) {
      iVar1 = sqlite3_load_extension(db,zFile,zProc,&local_38);
      if (iVar1 != 0) {
        context->isError = 1;
        sqlite3VdbeMemSetStr
                  (context->pOut,local_38,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(local_38);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void loadExt(sqlite3_context *context, int argc, sqlite3_value **argv){
  const char *zFile = (const char *)sqlite3_value_text(argv[0]);
  const char *zProc;
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zErrMsg = 0;

  /* Disallow the load_extension() SQL function unless the SQLITE_LoadExtFunc
  ** flag is set.  See the sqlite3_enable_load_extension() API.
  */
  if( (db->flags & SQLITE_LoadExtFunc)==0 ){
    sqlite3_result_error(context, "not authorized", -1);
    return;
  }

  if( argc==2 ){
    zProc = (const char *)sqlite3_value_text(argv[1]);
  }else{
    zProc = 0;
  }
  if( zFile && sqlite3_load_extension(db, zFile, zProc, &zErrMsg) ){
    sqlite3_result_error(context, zErrMsg, -1);
    sqlite3_free(zErrMsg);
  }
}